

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::SetState(AActor *this,FState *newstate,bool nofunction)

{
  ushort uVar1;
  player_t *ppVar2;
  bool bVar3;
  undefined8 *puVar4;
  bool bVar5;
  int iVar6;
  undefined8 *puVar7;
  uint uVar8;
  FState *returned_state;
  FStateParamInfo stp;
  FState *local_48;
  FStateParamInfo local_40;
  
  if (((debugfile != (FILE *)0x0) && (ppVar2 = this->player, ppVar2 != (player_t *)0x0)) &&
     ((ppVar2->cheats & 0x2000) != 0)) {
    fprintf((FILE *)debugfile,"for pl %td: SetState while predicting!\n",
            ((long)(ppVar2[-0x3e51].weapons.Slots + 3) >> 5) * -0x30c30c30c30c30c3);
  }
  do {
    if (newstate == (FState *)0x0) {
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      return false;
    }
    if (this->state == (FState *)0x0) {
      uVar8 = 0xffffffff;
    }
    else {
      uVar8 = (uint)this->state->sprite;
    }
    this->state = newstate;
    iVar6 = GetTics(this,newstate);
    this->tics = iVar6;
    (this->renderflags).Value =
         ((byte)newstate->field_0x22 & 1) << 4 | (this->renderflags).Value & 0xffffffef;
    uVar1 = newstate->sprite;
    if (uVar1 != 1) {
      if ((newstate->field_0x22 & 2) == 0) {
        this->frame = newstate->Frame;
      }
      if (uVar1 != 2) {
        if ((((this->flags4).Value & 0x20) == 0) && (uVar1 == this->SpawnState->sprite)) {
          ppVar2 = this->player;
          if (skins == (FPlayerSkin *)0x0 || ppVar2 == (player_t *)0x0) {
            if (uVar8 != uVar1) goto LAB_0051e70f;
          }
          else {
            puVar4 = (undefined8 *)
                     ((long)&((ppVar2->userinfo).
                              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                             .Nodes)->Next +
                     (ulong)(((ppVar2->userinfo).
                              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                              .Size - 1 & 0x1ea) * 0x18));
            do {
              puVar7 = puVar4;
              puVar4 = (undefined8 *)*puVar7;
            } while (*(int *)(puVar7 + 1) != 0x1ea);
            this->sprite = (WORD)skins[*(int *)(puVar7[2] + 0x28)].sprite;
          }
        }
        else {
LAB_0051e70f:
          this->sprite = uVar1;
        }
      }
    }
    if (nofunction) {
LAB_0051e77d:
      newstate = newstate->NextState;
      iVar6 = 0;
    }
    else {
      local_40.mStateType = STATE_Actor;
      local_40.mPSPIndex = 1;
      local_40.mCallingState = newstate;
      bVar5 = FState::CallAction(newstate,this,this,&local_40,&local_48);
      iVar6 = 0;
      bVar3 = true;
      if (bVar5) {
        iVar6 = 0;
        if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (local_48 != (FState *)0x0) {
            this->tics = 0;
            iVar6 = 3;
            bVar3 = false;
            newstate = local_48;
          }
        }
        else {
          iVar6 = 1;
          bVar3 = false;
        }
      }
      if (bVar3) goto LAB_0051e77d;
    }
    if (iVar6 == 1) {
      return false;
    }
    if (this->tics != 0) {
      if (Renderer != (FRenderer *)0x0) {
        (*Renderer->_vptr_FRenderer[8])(Renderer,this);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool AActor::SetState (FState *newstate, bool nofunction)
{
	if (debugfile && player && (player->cheats & CF_PREDICTING))
		fprintf (debugfile, "for pl %td: SetState while predicting!\n", player-players);
	do
	{
		if (newstate == NULL)
		{
			state = NULL;
			Destroy ();
			return false;
		}
		int prevsprite, newsprite;

		if (state != NULL)
		{
			prevsprite = state->sprite;
		}
		else
		{
			prevsprite = -1;
		}
		state = newstate;
		tics = GetTics(newstate);
		renderflags = (renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (newstate->GetFullbright());
		newsprite = newstate->sprite;
		if (newsprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				frame = newstate->GetFrame();
			}
			if (newsprite != SPR_NOCHANGE)
			{ // okay to change sprite
				if (!(flags4 & MF4_NOSKIN) && newsprite == SpawnState->sprite)
				{ // [RH] If the new sprite is the same as the original sprite, and
				// this actor is attached to a player, use the player's skin's
				// sprite. If a player is not attached, do not change the sprite
				// unless it is different from the previous state's sprite; a
				// player may have been attached, died, and respawned elsewhere,
				// and we do not want to lose the skin on the body. If it wasn't
				// for Dehacked, I would move sprite changing out of the states
				// altogether, since actors rarely change their sprites after
				// spawning.
					if (player != NULL && skins != NULL)
					{
						sprite = skins[player->userinfo.GetSkin()].sprite;
					}
					else if (newsprite != prevsprite)
					{
						sprite = newsprite;
					}
				}
				else
				{
					sprite = newsprite;
				}
			}
		}

		if (!nofunction)
		{
			FState *returned_state;
			FStateParamInfo stp = { newstate, STATE_Actor, PSP_WEAPON };
			if (newstate->CallAction(this, this, &stp, &returned_state))
			{
				// Check whether the called action function resulted in destroying the actor
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return false;
				}
				if (returned_state != NULL)
				{ // The action was an A_Jump-style function that wants to change the next state.
					newstate = returned_state;
					tics = 0;		 // make sure we loop and set the new state properly
					continue;
				}
			}
		}
		newstate = newstate->GetNextState();
	} while (tics == 0);

	if (Renderer != NULL)
	{
		Renderer->StateChanged(this);
	}
	return true;
}